

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhCellWriteHeader(lhcell *pCell)

{
  uchar *buf;
  sxu16 sVar1;
  uint uVar2;
  lhpage *plVar3;
  uchar *puVar4;
  ushort uVar5;
  ulong uVar6;
  
  plVar3 = pCell->pPage;
  puVar4 = plVar3->pRaw->zData;
  uVar6 = (ulong)pCell->iStart;
  uVar2 = pCell->nHash;
  buf = puVar4 + uVar6 + 8;
  *(uint *)(buf + -8) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = pCell->nKey;
  *(uint *)(buf + -4) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  SyBigEndianPack64(buf,pCell->nData);
  sVar1 = (plVar3->sHdr).iOfft;
  pCell->iNext = sVar1;
  buf[9] = (uchar)sVar1;
  puVar4[uVar6 + 0x10] = (uchar)(sVar1 >> 8);
  SyBigEndianPack64(puVar4 + uVar6 + 0x12,pCell->iOvfl);
  uVar5 = pCell->iStart;
  (plVar3->sHdr).iOfft = uVar5;
  uVar5 = uVar5 << 8 | uVar5 >> 8;
  *(ushort *)plVar3->pRaw->zData = uVar5;
  return (int)uVar5;
}

Assistant:

static int lhCellWriteHeader(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage;
	unsigned char *zRaw = pPage->pRaw->zData;
	/* Seek to the desired location */
	zRaw += pCell->iStart;
	/* 4 byte hash number */
	SyBigEndianPack32(zRaw,pCell->nHash);
	zRaw += 4;
	/* 4 byte key length */
	SyBigEndianPack32(zRaw,pCell->nKey);
	zRaw += 4;
	/* 8 byte data length */
	SyBigEndianPack64(zRaw,pCell->nData);
	zRaw += 8;
	/* 2 byte offset of the next cell */
	pCell->iNext = pPage->sHdr.iOfft;
	SyBigEndianPack16(zRaw,pCell->iNext);
	zRaw += 2;
	/* 8 byte overflow page number */
	SyBigEndianPack64(zRaw,pCell->iOvfl);
	/* Update the page header */
	pPage->sHdr.iOfft = pCell->iStart;
	/* pEngine->pIo->xWrite() has been successfully called on this page */
	SyBigEndianPack16(pPage->pRaw->zData,pCell->iStart);
	/* All done */
	return UNQLITE_OK;
}